

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_closed_set_normalizer.cc
# Opt level: O1

void __thiscall
s2builderutil::ClosedSetNormalizer::ClosedSetNormalizer
          (ClosedSetNormalizer *this,Options *options,
          vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
          *graph_options_out)

{
  vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_> *this_00;
  vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_> *this_01;
  pointer pGVar1;
  long lVar2;
  S2LogMessage local_40;
  
  this->options_ = *options;
  this_00 = &this->graph_options_out_;
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::vector
            (this_00,graph_options_out);
  this_01 = &this->graph_options_in_;
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::vector
            (this_01,this_00);
  (this->sentinel_).first = 0x7fffffff;
  (this->sentinel_).second = 0x7fffffff;
  (this->is_suppressed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_suppressed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->is_suppressed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_suppressed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_suppressed_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  (this->in_edges2_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->in_edges2_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->in_edges2_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->new_graphs_).super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_graphs_).super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_graphs_).super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->new_edges_[0].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->new_edges_[0].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->new_edges_[0].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->new_edges_[1].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->new_edges_[1].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->new_edges_[1].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->new_edges_[2].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->new_edges_[2].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->new_edges_[2].super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->new_input_edge_ids_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->new_input_edge_ids_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->new_input_edge_ids_[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->new_input_edge_ids_[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->new_input_edge_ids_[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->new_input_edge_ids_[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->new_input_edge_ids_[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->new_input_edge_ids_[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->new_input_edge_ids_[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IdSetLexicon::IdSetLexicon(&this->new_input_edge_id_set_lexicon_);
  if ((long)(this->graph_options_out_).
            super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->graph_options_out_).
            super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x3c) {
    if (((this_00->
         super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>).
         _M_impl.super__Vector_impl_data._M_start)->edge_type_ == DIRECTED) {
      if ((this_00->
          super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>).
          _M_impl.super__Vector_impl_data._M_start[2].edge_type_ == DIRECTED) {
        if ((this_00->
            super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>).
            _M_impl.super__Vector_impl_data._M_start[1].sibling_pairs_ == CREATE) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
                     ,0x39,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,
                     "Check failed: graph_options_out_[1].sibling_pairs() != SiblingPairs::CREATE ",
                     0x4c);
        }
        else {
          if ((this_00->
              super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>)
              ._M_impl.super__Vector_impl_data._M_start[1].sibling_pairs_ != REQUIRE) {
            pGVar1 = (this_01->
                     super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar2 = 0;
            do {
              (&pGVar1->allow_vertex_filtering_)[lVar2] = false;
              lVar2 = lVar2 + 0x14;
            } while (lVar2 != 0x3c);
            pGVar1 = (this_01->
                     super__Vector_base<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pGVar1[1].degenerate_edges_ = DISCARD_EXCESS;
            pGVar1[2].degenerate_edges_ = DISCARD_EXCESS;
            pGVar1[2].sibling_pairs_ = DISCARD_EXCESS;
            return;
          }
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
                     ,0x3a,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,
                     "Check failed: graph_options_out_[1].sibling_pairs() != SiblingPairs::REQUIRE "
                     ,0x4d);
        }
      }
      else {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
                   ,0x34,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_40.stream_,
                   "Check failed: graph_options_out_[2].edge_type() == EdgeType::DIRECTED ",0x46);
      }
    }
    else {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
                 ,0x33,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,
                 "Check failed: graph_options_out_[0].edge_type() == EdgeType::DIRECTED ",0x46);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_closed_set_normalizer.cc"
               ,0x32,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: (graph_options_out_.size()) == (3) ",0x31);
  }
  abort();
}

Assistant:

ClosedSetNormalizer::ClosedSetNormalizer(
    const Options& options, const vector<GraphOptions>& graph_options_out)
    : options_(options),
      graph_options_out_(graph_options_out),
      graph_options_in_(graph_options_out_),
      sentinel_(std::numeric_limits<VertexId>::max(),
                std::numeric_limits<VertexId>::max()) {
  S2_DCHECK_EQ(graph_options_out_.size(), 3);
  S2_DCHECK(graph_options_out_[0].edge_type() == EdgeType::DIRECTED);
  S2_DCHECK(graph_options_out_[2].edge_type() == EdgeType::DIRECTED);

  // NOTE(ericv): Supporting these options would require some extra code in
  // order to handle undirected edges, and they are not useful for building
  // polylines anyway (they are intended for polygon meshes).
  S2_DCHECK(graph_options_out_[1].sibling_pairs() != SiblingPairs::CREATE);
  S2_DCHECK(graph_options_out_[1].sibling_pairs() != SiblingPairs::REQUIRE);

  // Set the GraphOptions for the input graphs to ensure that (1) they share a
  // common set of vertices, (2) degenerate edges are kept only if they are
  // isolated, and (3) multiple copies of siblings pairs are discarded.  (Note
  // that there may be multiple copies of isolated degenerate edges; clients
  // can eliminate them if desired using DuplicateEdges::MERGE.)
  for (int dim = 0; dim < 3; ++dim) {
    graph_options_in_[dim].set_allow_vertex_filtering(false);
  }
  graph_options_in_[1].set_degenerate_edges(DegenerateEdges::DISCARD_EXCESS);
  graph_options_in_[2].set_degenerate_edges(DegenerateEdges::DISCARD_EXCESS);
  graph_options_in_[2].set_sibling_pairs(SiblingPairs::DISCARD_EXCESS);
}